

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

ProString * __thiscall
QMakeEvaluator::first(ProString *__return_storage_ptr__,QMakeEvaluator *this,ProKey *variableName)

{
  long in_FS_OFFSET;
  QArrayDataPointer<ProString> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  values((ProStringList *)&local_30,this,variableName);
  if (local_30.size == 0) {
    ProString::ProString(__return_storage_ptr__);
  }
  else {
    ProString::ProString(__return_storage_ptr__,local_30.ptr);
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

ProString QMakeEvaluator::first(const ProKey &variableName) const
{
    const ProStringList &vals = values(variableName);
    if (!vals.isEmpty())
        return vals.first();
    return ProString();
}